

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_PcmRamWrite(VGMPlayer *this)

{
  UINT8 chipType;
  UINT8 *pUVar1;
  long lVar2;
  byte chipID;
  CHIP_DEVICE *pCVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  uVar8 = this->_fileData[(ulong)this->_filePos + 2] & 0x7f;
  if (0x3f < (byte)uVar8) {
    return;
  }
  chipType = _VGM_BANK_CHIPS[uVar8];
  chipID = this->_fileData[(ulong)this->_filePos + 2] >> 7;
  pCVar3 = GetDevicePtr(this,chipType,chipID);
  if (pCVar3 == (CHIP_DEVICE *)0x0) {
    return;
  }
  if (pCVar3->romWrite == (DEVFUNC_WRITE_BLOCK)0x0) {
    return;
  }
  pUVar1 = this->_fileData;
  uVar6 = (ulong)this->_filePos;
  lVar2 = (long)this->_pcmBank[uVar8].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)((long)this->_pcmBank[uVar8].data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - lVar2) <=
      (ulong)CONCAT21(*(undefined2 *)(pUVar1 + uVar6 + 4),pUVar1[uVar6 + 3])) {
    return;
  }
  UVar5 = (UINT32)CONCAT21(*(undefined2 *)(pUVar1 + uVar6 + 7),pUVar1[uVar6 + 6]);
  UVar4 = 0x1000000;
  if (CONCAT21(*(undefined2 *)(pUVar1 + uVar6 + 10),pUVar1[uVar6 + 9]) != 0) {
    UVar4 = (UINT32)CONCAT21(*(undefined2 *)(pUVar1 + uVar6 + 10),pUVar1[uVar6 + 9]);
  }
  if (chipType == '\x05') {
    lVar7 = 0x355c;
  }
  else {
    if (chipType != '\x10') goto LAB_0012366c;
    lVar7 = 0x355e;
  }
  UVar5 = UVar5 | (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                                 (ulong)chipID + lVar7) << 0xc;
LAB_0012366c:
  (*pCVar3->romWrite)((pCVar3->base).defInf.dataPtr,UVar5,UVar4,
                      (UINT8 *)(lVar2 + (ulong)CONCAT21(*(undefined2 *)(pUVar1 + uVar6 + 4),
                                                        pUVar1[uVar6 + 3])));
  return;
}

Assistant:

void VGMPlayer::Cmd_PcmRamWrite(void)
{
	UINT8 dbType = fData[0x02] & 0x7F;
	if (dbType >= _PCM_BANK_COUNT)
		return;
	
	UINT8 chipType = _VGM_BANK_CHIPS[dbType];
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->romWrite == NULL)
		return;
	
	UINT32 dbPos = ReadLE24(&fData[0x03]);
	UINT32 wrtAddr = ReadLE24(&fData[0x06]);
	UINT32 dataLen = ReadLE24(&fData[0x09]);
	if (dbPos >= _pcmBank[dbType].data.size())
		return;
	const UINT8* ROMData = &_pcmBank[dbType].data[dbPos];
	if (! dataLen)
		dataLen += 0x01000000;
	
	if (chipType == 0x14)	// NES APU
	{
		//Last95Drum = dbPos / dataLen - 1;
		//Last95Max = _pcmBank[dbType].data.size() / dataLen;
	}
	
	DoRAMOfsPatches(chipType, chipID, wrtAddr, dataLen);
	cDev->romWrite(cDev->base.defInf.dataPtr, wrtAddr, dataLen, ROMData);
	
	return;
}